

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_json_schema.cpp
# Opt level: O0

void __thiscall
flatbuffers::jsons::JsonSchemaGenerator::JsonSchemaGenerator
          (JsonSchemaGenerator *this,Parser *parser,string *path,string *file_name)

{
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  string *local_28;
  string *file_name_local;
  string *path_local;
  Parser *parser_local;
  JsonSchemaGenerator *this_local;
  
  local_28 = file_name;
  file_name_local = path;
  path_local = (string *)parser;
  parser_local = (Parser *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"",&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"json",&local_a9);
  BaseGenerator::BaseGenerator
            (&this->super_BaseGenerator,parser,path,file_name,&local_48,&local_80,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  (this->super_BaseGenerator)._vptr_BaseGenerator = (_func_int **)&PTR_generate_004fb4f8;
  std::__cxx11::string::string((string *)&this->code_);
  return;
}

Assistant:

JsonSchemaGenerator(const Parser &parser, const std::string &path,
                      const std::string &file_name)
      : BaseGenerator(parser, path, file_name, "", "", "json") {}